

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.c
# Opt level: O2

int lws_hpack_dynamic_size(lws *wsi,int size)

{
  hpack_dynamic_table *dyn;
  hpack_dt_entry *phVar1;
  ushort uVar2;
  ushort uVar3;
  uint32_t uVar4;
  lws_h2_netconn *plVar5;
  uint16_t uVar6;
  uint16_t uVar7;
  uint16_t uVar8;
  undefined2 uVar9;
  uint uVar10;
  lws *wsi_00;
  hpack_dt_entry *phVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  hpack_dt_entry *phVar17;
  uint uVar18;
  uint uVar19;
  bool bVar20;
  
  uVar15 = (ulong)(uint)size;
  wsi_00 = lws_get_network_wsi(wsi);
  plVar5 = (wsi_00->h2).h2n;
  if (plVar5 != (lws_h2_netconn *)0x0) {
    _lws_log(8,"%s: from %d to %d, lim %u\n","lws_hpack_dynamic_size",
             (ulong)(plVar5->hpack_dyn_table).num_entries,uVar15,(ulong)(wsi_00->vhost->h2).set.s[1]
            );
    if (size == 0) {
      size = (uint)(plVar5->hpack_dyn_table).num_entries << 3;
      lws_hpack_destroy_dynamic_header(wsi);
    }
    if ((int)(wsi_00->vhost->h2).set.s[1] < size) {
      _lws_log(8,"rejecting hpack dyn size %u vs %u\n",(ulong)(uint)size);
      uVar4 = (wsi_00->vhost->h2).set.s[1];
      bVar20 = size == 0x10001;
      size = uVar4;
      if ((bVar20) && (uVar4 == 0x10000)) {
        lws_h2_goaway(wsi_00,9,"Asked for header table bigger than we told");
        uVar15 = 0x10001;
        goto LAB_0012fc64;
      }
    }
    (plVar5->hpack_dyn_table).virtual_payload_max = size;
    uVar10 = (uint)((long)size / 8);
    uVar15 = (long)size / 8 & 0xffffffff;
    uVar2 = (plVar5->hpack_dyn_table).num_entries;
    if (uVar10 == uVar2) {
      return 0;
    }
    uVar3 = (plVar5->hpack_dyn_table).used_entries;
    uVar18 = (uint)uVar3;
    if ((int)uVar10 < (int)(uint)uVar3) {
      uVar18 = uVar10;
    }
    if ((int)(uint)uVar2 <= (int)uVar18) {
      uVar18 = (uint)uVar2;
    }
    phVar11 = (hpack_dt_entry *)lws_zalloc((long)(int)uVar10 * 0x10 + 0x10,"dynamic table entries");
    if (phVar11 != (hpack_dt_entry *)0x0) {
      dyn = &plVar5->hpack_dyn_table;
      do {
        uVar12 = (plVar5->hpack_dyn_table).virtual_payload_usage;
        uVar2 = (plVar5->hpack_dyn_table).used_entries;
        uVar19 = (uint)uVar2;
        if (uVar12 == 0) {
LAB_0012fc93:
          if ((int)uVar18 < (int)uVar19) {
            uVar19 = uVar18;
          }
          if (dyn->entries != (hpack_dt_entry *)0x0) {
            uVar13 = 0;
            uVar16 = 0;
            phVar17 = phVar11;
            if (0 < (int)uVar19) {
              uVar16 = (ulong)uVar19;
            }
            for (; uVar16 != uVar13; uVar13 = uVar13 + 1) {
              uVar18 = (uint)(plVar5->hpack_dyn_table).num_entries;
              iVar14 = (int)(((uint)(plVar5->hpack_dyn_table).pos -
                             (uint)(plVar5->hpack_dyn_table).used_entries) + (int)uVar13) %
                       (int)uVar18;
              phVar1 = (plVar5->hpack_dyn_table).entries + (int)((iVar14 >> 0x1f & uVar18) + iVar14)
              ;
              uVar6 = phVar1->value_len;
              uVar7 = phVar1->hdr_len;
              uVar8 = phVar1->lws_hdr_idx;
              uVar9 = *(undefined2 *)&phVar1->field_0xe;
              phVar17->value = phVar1->value;
              phVar17->value_len = uVar6;
              phVar17->hdr_len = uVar7;
              phVar17->lws_hdr_idx = uVar8;
              *(undefined2 *)&phVar17->field_0xe = uVar9;
              phVar17 = phVar17 + 1;
            }
            lws_realloc(dyn->entries,0,"lws_free");
          }
          (plVar5->hpack_dyn_table).entries = phVar11;
          (plVar5->hpack_dyn_table).num_entries = (uint16_t)uVar15;
          (plVar5->hpack_dyn_table).used_entries = (uint16_t)uVar19;
          if (size + 7U < 0xf) {
            (plVar5->hpack_dyn_table).pos = 0;
          }
          else {
            (plVar5->hpack_dyn_table).pos = (uint16_t)((int)uVar19 % (int)uVar10);
          }
          return 0;
        }
        if (uVar2 == 0) {
          uVar19 = 0;
          goto LAB_0012fc93;
        }
        if (uVar12 <= (plVar5->hpack_dyn_table).virtual_payload_max) goto LAB_0012fc93;
        uVar12 = (uint)(plVar5->hpack_dyn_table).num_entries;
        iVar14 = (int)((plVar5->hpack_dyn_table).pos - uVar19) % (int)uVar12;
        lws_dynamic_free(dyn,(iVar14 >> 0x1f & uVar12) + iVar14);
      } while( true );
    }
  }
LAB_0012fc64:
  _lws_log(8,"%s: failed to resize to %d\n","lws_hpack_dynamic_size",uVar15);
  return 1;
}

Assistant:

int
lws_hpack_dynamic_size(struct lws *wsi, int size)
{
	struct hpack_dynamic_table *dyn;
	struct hpack_dt_entry *dte;
	struct lws *nwsi;
	int min, n = 0, m;

	/*
	 * "size" here is coming from the http/2 SETTING
	 * SETTINGS_HEADER_TABLE_SIZE.  This is a (virtual, in our case)
	 * linear buffer containing dynamic header names and values... when it
	 * is full, old entries are evicted.
	 *
	 * We encode the header as an lws_hdr_idx, which is all the rest of
	 * lws cares about; if there is no matching header we store an empty
	 * entry in the dyn table as a placeholder.
	 *
	 * So to make the two systems work together we keep an accounting of
	 * what we are using to decide when to evict... we must only evict
	 * things when the remote peer's accounting also makes him feel he
	 * should evict something.
	 */

	nwsi = lws_get_network_wsi(wsi);
	if (!nwsi->h2.h2n)
		goto bail;

	dyn = &nwsi->h2.h2n->hpack_dyn_table;
	lwsl_info("%s: from %d to %d, lim %u\n", __func__,
		  (int)dyn->num_entries, size,
		  (unsigned int)nwsi->vhost->h2.set.s[H2SET_HEADER_TABLE_SIZE]);

	if (!size) {
		size = dyn->num_entries * 8;
		lws_hpack_destroy_dynamic_header(wsi);
	}

	if (size > (int)nwsi->vhost->h2.set.s[H2SET_HEADER_TABLE_SIZE]) {
		lwsl_info("rejecting hpack dyn size %u vs %u\n", size,
			  (unsigned int)nwsi->vhost->h2.set.s[H2SET_HEADER_TABLE_SIZE]);

		// this seems necessary to work with some browsers

		if (nwsi->vhost->h2.set.s[H2SET_HEADER_TABLE_SIZE] == 65536 &&
				size == 65537) { /* h2spec */
			lws_h2_goaway(nwsi, H2_ERR_COMPRESSION_ERROR,
				  "Asked for header table bigger than we told");
			goto bail;
		}

		size = nwsi->vhost->h2.set.s[H2SET_HEADER_TABLE_SIZE];
	}

	dyn->virtual_payload_max = size;

	size = size / 8;
	min = size;
	if (min > dyn->used_entries)
		min = dyn->used_entries;

	if (size == dyn->num_entries)
		return 0;

	if (dyn->num_entries < min)
		min = dyn->num_entries;

	// lwsl_notice("dte requested size %d\n", size);

	dte = lws_zalloc(sizeof(*dte) * (size + 1), "dynamic table entries");
	if (!dte)
		goto bail;

	while (dyn->virtual_payload_usage && dyn->used_entries &&
	       dyn->virtual_payload_usage > dyn->virtual_payload_max) {
		n = (dyn->pos - dyn->used_entries) % dyn->num_entries;
		if (n < 0)
			n += dyn->num_entries;
		lws_dynamic_free(dyn, n);
	}

	if (min > dyn->used_entries)
		min = dyn->used_entries;

	if (dyn->entries) {
		for (n = 0; n < min; n++) {
			m = (dyn->pos - dyn->used_entries + n) %
						dyn->num_entries;
			if (m < 0)
				m += dyn->num_entries;
			dte[n] = dyn->entries[m];
		}

		lws_free(dyn->entries);
	}

	dyn->entries = dte;
	dyn->num_entries = size;
	dyn->used_entries = min;
	if (size)
		dyn->pos = min % size;
	else
		dyn->pos = 0;

	lws_h2_dynamic_table_dump(wsi);

	return 0;

bail:
	lwsl_info("%s: failed to resize to %d\n", __func__, size);

	return 1;
}